

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void Handler_weaponslot_ISsssssssssssssssssssssssssssssssssssssssssss_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  uint uVar1;
  char *tail;
  PClass *pPVar2;
  PClass *pPVar3;
  FString *this;
  long lVar4;
  bool bVar5;
  FString weapons;
  FString local_38;
  
  pPVar2 = PClassPlayerPawn::RegistrationInfo.MyClass;
  uVar1 = params[1].i;
  pPVar3 = *(PClass **)
            ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.super_PTypeBase + 8);
  if (pPVar3 == (PClass *)0x0) {
    pPVar3 = (PClass *)
             (*(code *)**(undefined8 **)
                         &(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase)(info);
    *(PClass **)
     ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
             super_PCompoundType.super_PType.super_PTypeBase + 8) = pPVar3;
  }
  bVar5 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar2 && bVar5) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar5 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar2) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar5) {
    __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0xb93,
                  "void Handler_weaponslot_ISsssssssssssssssssssssssssssssssssssssssssss_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                 );
  }
  if (9 < uVar1) {
    I_Error("Slot must be between 0 and 9.");
    return;
  }
  local_38.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  for (lVar4 = 1; lVar4 < params->i; lVar4 = lVar4 + 1) {
    tail = params[lVar4 + 1].s;
    this = FString::operator+=(&local_38,' ');
    FString::operator+=(this,tail);
  }
  FString::operator=((FString *)
                     ((long)&info[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType
                             .super_PCompoundType.super_PType.super_PTypeBase +
                     (ulong)uVar1 * 8 + 0x20),local_38.Chars + 1);
  FString::~FString(&local_38);
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, weaponslot, ISsssssssssssssssssssssssssssssssssssssssssss, PlayerPawn)
{
	PROP_INT_PARM(slot, 0);

	assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	if (slot < 0 || slot > 9)
	{
		I_Error("Slot must be between 0 and 9.");
	}
	else
	{
		FString weapons;

		for(int i = 1; i < PROP_PARM_COUNT; ++i)
		{
			PROP_STRING_PARM(str, i);
			weapons << ' ' << str;
		}
		static_cast<PClassPlayerPawn *>(info)->Slot[slot] = &weapons[1];
	}
}